

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void get_ea_mode_op(m68k_info *info,cs_m68k_op *op,uint instruction,uint size)

{
  uint uVar1;
  undefined8 uVar2;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar3;
  ulong uVar4;
  _Bool in_R8B;
  
  op->type = M68K_OP_MEM;
  switch(instruction & 0x3f) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    (op->field_0).reg = (instruction & 7) + M68K_REG_D0;
    uVar2 = 0x100000001;
    goto LAB_0024331a;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    (op->field_0).reg = (instruction & 7) + M68K_REG_A0;
    uVar2 = 0x200000001;
LAB_0024331a:
    op->type = (int)uVar2;
    op->address_mode = (int)((ulong)uVar2 >> 0x20);
    return;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    op->address_mode = M68K_AM_REGI_ADDR;
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    op->address_mode = M68K_AM_REGI_ADDR_POST_INC;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    op->address_mode = M68K_AM_REGI_ADDR_PRE_DEC;
    break;
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    op->address_mode = M68K_AM_REGI_ADDR_DISP;
    (op->mem).base_reg = (instruction & 7) + M68K_REG_A0;
    goto LAB_00243330;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    uVar1 = 0;
    goto LAB_00243340;
  case 0x38:
    op->address_mode = M68K_AM_ABSOLUTE_DATA_SHORT;
LAB_0024334d:
    uVar1 = read_imm_16(info);
    goto LAB_0024338d;
  case 0x39:
    op->address_mode = M68K_AM_ABSOLUTE_DATA_LONG;
LAB_00243388:
    uVar1 = read_imm_32(info);
    goto LAB_0024338d;
  case 0x3a:
    op->address_mode = M68K_AM_PCI_DISP;
LAB_00243330:
    uVar1 = read_imm_16(info);
    (op->mem).disp = (int16_t)uVar1;
    return;
  case 0x3b:
    uVar1 = 1;
LAB_00243340:
    get_with_index_address_mode(info,op,instruction,uVar1,in_R8B);
    return;
  case 0x3c:
    op->type = M68K_OP_IMM;
    op->address_mode = M68K_AM_IMMEDIATE;
    if (size == 4) goto LAB_00243388;
    if (size == 2) goto LAB_0024334d;
    if (size != 1) {
      uVar4 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
      if (info->code_len < uVar4 + 8) {
        uVar4 = 0xaaaaaaaaaaaaaaaa;
      }
      else {
        uVar4 = *(ulong *)(info->code + uVar4);
        uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                uVar4 << 0x38;
      }
      info->pc = info->pc + 8;
      (op->field_0).imm = uVar4;
      return;
    }
    uVar1 = read_imm_8(info);
LAB_0024338d:
    aVar3.reg_pair.reg_1 = 0;
    aVar3.reg = uVar1;
    op->field_0 = aVar3;
  default:
    goto switchD_002432cd_default;
  }
  (op->field_0).reg = (instruction & 7) + M68K_REG_A0;
switchD_002432cd_default:
  return;
}

Assistant:

static void get_ea_mode_op(m68k_info *info, cs_m68k_op* op, uint instruction, uint size)
{
	// default to memory

	op->type = M68K_OP_MEM;

	switch (instruction & 0x3f) {
		case 0x00: case 0x01: case 0x02: case 0x03: case 0x04: case 0x05: case 0x06: case 0x07:
			/* data register direct */
			op->address_mode = M68K_AM_REG_DIRECT_DATA;
			op->reg = M68K_REG_D0 + (instruction & 7);
			op->type = M68K_OP_REG;
			break;

		case 0x08: case 0x09: case 0x0a: case 0x0b: case 0x0c: case 0x0d: case 0x0e: case 0x0f:
			/* address register direct */
			op->address_mode = M68K_AM_REG_DIRECT_ADDR;
			op->reg = M68K_REG_A0 + (instruction & 7);
			op->type = M68K_OP_REG;
			break;

		case 0x10: case 0x11: case 0x12: case 0x13: case 0x14: case 0x15: case 0x16: case 0x17:
			/* address register indirect */
			op->address_mode = M68K_AM_REGI_ADDR;
			op->reg = M68K_REG_A0 + (instruction & 7);
			break;

		case 0x18: case 0x19: case 0x1a: case 0x1b: case 0x1c: case 0x1d: case 0x1e: case 0x1f:
			/* address register indirect with postincrement */
			op->address_mode = M68K_AM_REGI_ADDR_POST_INC;
			op->reg = M68K_REG_A0 + (instruction & 7);
			break;

		case 0x20: case 0x21: case 0x22: case 0x23: case 0x24: case 0x25: case 0x26: case 0x27:
			/* address register indirect with predecrement */
			op->address_mode = M68K_AM_REGI_ADDR_PRE_DEC;
			op->reg = M68K_REG_A0 + (instruction & 7);
			break;

		case 0x28: case 0x29: case 0x2a: case 0x2b: case 0x2c: case 0x2d: case 0x2e: case 0x2f:
			/* address register indirect with displacement*/
			op->address_mode = M68K_AM_REGI_ADDR_DISP;
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			op->mem.disp = (int16_t)read_imm_16(info);
			break;

		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34: case 0x35: case 0x36: case 0x37:
			/* address register indirect with index */
			get_with_index_address_mode(info, op, instruction, size, false);
			break;

		case 0x38:
			/* absolute short address */
			op->address_mode = M68K_AM_ABSOLUTE_DATA_SHORT;
			op->imm = read_imm_16(info);
			break;

		case 0x39:
			/* absolute long address */
			op->address_mode = M68K_AM_ABSOLUTE_DATA_LONG;
			op->imm = read_imm_32(info);
			break;

		case 0x3a:
			/* program counter with displacement */
			op->address_mode = M68K_AM_PCI_DISP;
			op->mem.disp = (int16_t)read_imm_16(info);
			break;

		case 0x3b:
			/* program counter with index */
			get_with_index_address_mode(info, op, instruction, size, true);
			break;

		case 0x3c:
			op->address_mode = M68K_AM_IMMEDIATE;
			op->type = M68K_OP_IMM;

			if (size == 1)
				op->imm = read_imm_8(info) & 0xff;
			else if (size == 2)
				op->imm = read_imm_16(info) & 0xffff;
			else if (size == 4)
				op->imm = read_imm_32(info);
			else
				op->imm = read_imm_64(info);

			break;

		default:
			break;
	}
}